

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_strip_synclos_bound(sexp ctx,sexp x,int depth)

{
  sexp psVar1;
  sexp psVar2;
  sexp kar;
  sexp res;
  sexp kdr;
  sexp local_68;
  undefined8 local_60;
  sexp local_58;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  sexp_gc_var_t local_30;
  
  local_30.var = &local_68;
  local_60 = 0x43e;
  local_68 = (sexp)0x43e;
  local_58 = (sexp)0x43e;
  if (0 < depth) {
    local_50.var = (sexp_conflict *)&local_60;
    local_30.next = &local_50;
    local_50.next = (ctx->value).context.saves;
    local_40.next = &local_30;
    local_40.var = &local_58;
    (ctx->value).context.saves = &local_40;
    for (; (((ulong)x & 3) == 0 && (x->tag == 0x16)); x = (x->value).type.slots) {
    }
    if (((ulong)x & 3) == 0) {
      if (x->tag == 6) {
        local_68 = sexp_strip_synclos_bound(ctx,(x->value).type.name,depth + -1);
        local_58 = sexp_strip_synclos_bound(ctx,(x->value).type.cpl,depth + -1);
        psVar2 = sexp_cons_op(ctx,(sexp)0x0,2,local_68,local_58);
        (psVar2->value).type.slots = (x->value).type.slots;
        psVar2->field_0x5 = psVar2->field_0x5 | 1;
        x = psVar2;
      }
      else if ((x->tag == 10) && ((x->value).type.name != (sexp)0x0)) {
        psVar2 = (sexp)0x0;
        local_30.var = &local_68;
        do {
          psVar1 = sexp_strip_synclos_bound
                             (ctx,*(sexp *)((long)&x->value + (long)psVar2 * 8 + 8),depth + -1);
          *(sexp *)((long)&x->value + (long)psVar2 * 8 + 8) = psVar1;
          psVar2 = (sexp)((long)&psVar2->tag + 1);
        } while (psVar2 < (x->value).type.name);
      }
    }
    (ctx->value).context.saves = local_50.next;
  }
  return x;
}

Assistant:

sexp sexp_strip_synclos_bound (sexp ctx, sexp x, int depth) {
  int i;
  sexp_gc_var3(res, kar, kdr);
  if (depth <= 0) return x;
  sexp_gc_preserve3(ctx, res, kar, kdr);
  x = sexp_id_name(x);
  if (sexp_pairp(x)) {
    kar = sexp_strip_synclos_bound(ctx, sexp_car(x), depth-1);
    kdr = sexp_strip_synclos_bound(ctx, sexp_cdr(x), depth-1);
    res = sexp_cons(ctx, kar, kdr);
    sexp_pair_source(res) = sexp_pair_source(x);
    sexp_immutablep(res) = 1;
  } else {
    if (sexp_vectorp(x))
      for (i = 0; i < sexp_vector_length(x); ++i)
        sexp_vector_set(x, sexp_make_fixnum(i), sexp_strip_synclos_bound(ctx, sexp_vector_ref(x, sexp_make_fixnum(i)), depth-1));
    res = x;
  }
  sexp_gc_release3(ctx);
  return res;
}